

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O2

Iterator __thiscall
axl::sl::
HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
::visit(HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
        *this,Guid *key)

{
  ListLink *pLVar1;
  undefined8 uVar2;
  bool bVar3;
  size_t sVar4;
  AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>
  *pAVar5;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>
  IVar6;
  size_t sVar7;
  
  sVar7 = (this->m_table).
          super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
          .m_count;
  if (sVar7 == 0) {
    sVar7 = 0x20;
    bVar3 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>>>
            ::
            setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>>::Construct>
                      ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>>>
                        *)&this->m_table,0x20);
    if (!bVar3) {
      return (Iterator)(Entry *)0x0;
    }
  }
  sVar4 = Guid::hash(key);
  pAVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
           ::p(&this->m_table);
  IVar6.m_p = pAVar5[sVar4 % sVar7].
              super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
              .super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
              m_head;
  while( true ) {
    if (IVar6.m_p == (HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*> *)0x0) {
      IVar6.m_p = (Entry *)operator_new(0x40);
      ((IVar6.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).super_ListLink.m_next
           = (ListLink *)0x0;
      ((IVar6.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).super_ListLink.m_prev
           = (ListLink *)0x0;
      ((IVar6.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_value =
           (ErrorProvider *)0x0;
      ((IVar6.m_p)->m_bucketLink).m_next = (ListLink *)0x0;
      ((IVar6.m_p)->m_bucketLink).m_prev = (ListLink *)0x0;
      *(undefined8 *)
       &((IVar6.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0 = 0;
      *(undefined8 *)
       ((long)&((IVar6.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0
       + 8) = 0;
      uVar2 = *(undefined8 *)((long)&key->field_0 + 8);
      *(undefined8 *)
       &((IVar6.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0 =
           *(undefined8 *)&key->field_0;
      *(undefined8 *)
       ((long)&((IVar6.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0
       + 8) = uVar2;
      (IVar6.m_p)->m_bucket = pAVar5 + sVar4 % sVar7;
      ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>_>
      ::insertTail((ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>_>
                    *)this,IVar6.m_p);
      ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
      ::insertTail(&pAVar5[sVar4 % sVar7].
                    super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
                   ,IVar6.m_p);
      if (this->m_resizeThreshold <
          ((this->m_list).
           super_OwningListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>_>
           .
           super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>_>
           .super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
           m_count * 100) / sVar7) {
        setBucketCount(this,sVar7 * 2);
      }
      return (Iterator)IVar6.m_p;
    }
    bVar3 = Guid::isEqual(key,&((IVar6.m_p)->
                               super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key);
    if (bVar3) break;
    pLVar1 = ((IVar6.m_p)->m_bucketLink).m_next;
    IVar6.m_p = (Entry *)&pLVar1[-3].m_prev;
    if (pLVar1 == (ListLink *)0x0) {
      IVar6.m_p = (HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*> *)0x0;
    }
  }
  return (Iterator)IVar6.m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		size_t bucketCount = m_table.getCount();
		if (!bucketCount) {
			bucketCount = Def_InitialBucketCount;

			bool result = m_table.setCount(bucketCount);
			if (!result)
				return NULL;
		}

		size_t hash = m_hash(key);
		Bucket* bucket = &m_table.rwi()[hash % bucketCount];
		typename Bucket::Iterator it = bucket->getHead();
		for (; it; it++) {
			bool isEqual = m_eq(key, it->m_key);
			if (isEqual)
				return it;
		}

		Entry* entry = new (mem::ZeroInit) Entry;
		entry->m_key = key;
		entry->m_bucket = bucket;
		m_list.insertTail(entry);
		bucket->insertTail(entry);

	#if (AXL_PTR_BITS == 64)
		size_t loadFactor = getCount() * 100 / bucketCount;
	#else
		size_t loadFactor = (size_t)((uint64_t)getCount() * 100 / bucketCount);
	#endif

		if (loadFactor > m_resizeThreshold)
			setBucketCount(bucketCount * 2);

		return entry;
	}